

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastunpack5_8(uint32_t *in,uint32_t *out)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  uVar1 = *(ulong *)in;
  auVar4 = vpbroadcastd_avx512vl();
  auVar2 = vpsrlvd_avx2(auVar4,_DAT_0019e2f0);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar1;
  auVar5 = vpshufd_avx(auVar4,0x40);
  auVar4 = vpinsrd_avx(auVar5,(uint)(uVar1 >> 5) & 0x7ffffff,1);
  auVar3 = vpsrlvd_avx2(auVar5,_DAT_001aa1b0);
  auVar4 = vpunpcklqdq_avx(auVar4,auVar2);
  auVar5._8_4_ = 0x1f;
  auVar5._0_8_ = 0x1f0000001f;
  auVar5._12_4_ = 0x1f;
  auVar2 = vpinsrd_avx(auVar5,((uint)(uVar1 >> 0x20) & 7) << 2,2);
  auVar4 = vpand_avx(auVar4,auVar5);
  auVar5 = vpand_avx(auVar3,auVar5);
  auVar2 = vpor_avx(auVar3,auVar2);
  *(undefined1 (*) [16])out = auVar4;
  auVar4 = vpblendd_avx2(auVar5,auVar2,4);
  *(undefined1 (*) [16])(out + 4) = auVar4;
  return in + 2;
}

Assistant:

const uint32_t *__fastunpack5_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 5);
  out++;
  *out = ((*in) >> 5) % (1U << 5);
  out++;
  *out = ((*in) >> 10) % (1U << 5);
  out++;
  *out = ((*in) >> 15) % (1U << 5);
  out++;
  *out = ((*in) >> 20) % (1U << 5);
  out++;
  *out = ((*in) >> 25) % (1U << 5);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 3)) << (5 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 5);
  out++;

  return in + 1;
}